

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::splitUpLongerBodies(CFG *this)

{
  pointer ppPVar1;
  pointer pbVar2;
  Production *pPVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_101;
  vector<Production*,std::allocator<Production*>> *local_100;
  ulong local_f8;
  Production *production_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionTo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string previousVar;
  Production *production;
  string newVariable;
  
  local_100 = (vector<Production*,std::allocator<Production*>> *)&this->productionsP;
  local_f8 = 0;
  while( true ) {
    uVar5 = (ulong)(int)local_f8;
    ppPVar1 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar5) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&productionTo,&ppPVar1[uVar5]->toP);
    if ((ulong)((long)productionTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)productionTo.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
      iVar4 = (int)local_f8;
    }
    else {
      std::__cxx11::string::string
                ((string *)&previousVar,*(string **)(*(long *)local_100 + uVar5 * 8));
      uVar6 = 0;
      while( true ) {
        pbVar2 = productionTo.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)productionTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)productionTo.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar7 >> 5) - 2U <= uVar6) break;
        findNewUnusedVariableLetter_abi_cxx11_(&newVariable,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->nonTerminalsV,&newVariable);
        pPVar3 = (Production *)operator_new(0x38);
        std::__cxx11::string::string
                  ((string *)&local_c8,
                   (string *)
                   (productionTo.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::__cxx11::string::string(local_a8,(string *)&newVariable);
        __l._M_len = 2;
        __l._M_array = &local_c8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&production,__l,&local_101);
        Production::Production
                  (pPVar3,&previousVar,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&production);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&production);
        lVar7 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar7));
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
        production_1 = pPVar3;
        std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                  (local_100,&production_1);
        std::__cxx11::string::_M_assign((string *)&previousVar);
        std::__cxx11::string::~string((string *)&newVariable);
        uVar6 = uVar6 + 1;
      }
      pPVar3 = (Production *)operator_new(0x38);
      lVar7 = lVar7 * 0x8000000;
      std::__cxx11::string::string
                ((string *)&local_c8,
                 (string *)((long)&(pbVar2->_M_dataplus)._M_p + (lVar7 + -0x200000000 >> 0x1b)));
      std::__cxx11::string::string
                (local_a8,(string *)
                          ((long)&((productionTo.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          (lVar7 + -0x100000000 >> 0x1b)));
      __l_00._M_len = 2;
      __l_00._M_array = &local_c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&newVariable,__l_00,(allocator_type *)&production_1);
      Production::Production
                (pPVar3,&previousVar,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&newVariable);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&newVariable);
      lVar7 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
      production = pPVar3;
      std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                (local_100,&production);
      std::vector<Production_*,_std::allocator<Production_*>_>::erase
                ((vector<Production_*,_std::allocator<Production_*>_> *)local_100,
                 (Production **)(uVar5 * 8 + *(long *)local_100));
      iVar4 = (int)local_f8 + -1;
      std::__cxx11::string::~string((string *)&previousVar);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&productionTo);
    local_f8 = (ulong)(iVar4 + 1);
  }
  return;
}

Assistant:

void CFG::splitUpLongerBodies() {

    for (int i = 0; i < productionsP.size(); ++i) {

        auto productionTo = productionsP[i]->getToP();

        // Only modify variables longer than 2
        if (productionTo.size() > 2) {

            std::string previousVar = productionsP[i]->getFromP();

            for (int j = 0; j < productionTo.size() - 2; ++j) {
                std::string newVariable = findNewUnusedVariableLetter();
                nonTerminalsV.push_back(newVariable);
                Production *production = new Production(previousVar, {productionTo[j], newVariable});
                productionsP.emplace_back(production);
                previousVar = newVariable;
            }

            int lastElement = productionTo.size() - 1;
            Production *production = new Production(previousVar,
                                                    {productionTo[lastElement - 1], productionTo[lastElement]});
            productionsP.emplace_back(production);

            productionsP.erase(productionsP.begin() + i);
            i--;
        }
    }
}